

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool checkInterfacePropertyCompatibility<bool>
               (cmTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
               bool *param_6)

{
  _Rb_tree_header *p_Var1;
  cmTarget *pcVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  iterator iVar6;
  ostream *poVar7;
  size_t sVar8;
  pointer ppcVar9;
  int iVar10;
  bool bVar11;
  string reportEntry;
  string report;
  ostringstream e;
  string interfaceProperty;
  uint local_278;
  string local_268;
  long *local_248;
  long local_238 [2];
  cmTarget *local_228;
  string local_220;
  _Base_ptr local_200;
  _Base_ptr local_1f8;
  vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_> *local_1f0;
  _Base_ptr local_1e8;
  _Base_ptr local_1e0;
  char *local_1d8;
  pointer local_1d0;
  string local_1c8 [3];
  ios_base local_158 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar5 = cmTarget::GetProperty(tgt,p,tgt->Makefile);
  bVar4 = cmSystemTools::IsOn(pcVar5);
  local_278 = (uint)bVar4;
  local_1e0 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                      *)tgt,p);
  local_1e8 = &(tgt->Properties).
               super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
  bVar11 = local_1e0 != local_1e8;
  local_1f8 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_200 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_1f8 != local_200 && bVar11) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                  ,0x1314,
                  "PropertyType checkInterfacePropertyCompatibility(const cmTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = bool]"
                 );
  }
  local_1f0 = cmTarget::GetLinkImplementationClosure(tgt,config);
  if ((local_1f0->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (local_1f0->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220," * Target \"","");
    std::__cxx11::string::_M_append((char *)&local_220,(ulong)(tgt->Name)._M_dataplus._M_p);
    if (local_1e0 != local_1e8) {
      std::__cxx11::string::append((char *)&local_220);
      pcVar5 = "FALSE";
      if (bVar4) {
        pcVar5 = "TRUE";
      }
      local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,pcVar5,pcVar5 + ((ulong)bVar4 ^ 5));
      std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_1c8[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
        operator_delete(local_1c8[0]._M_dataplus._M_p,local_1c8[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    std::__cxx11::string::append((char *)&local_220);
    local_228 = tgt;
    std::operator+(&local_50,"INTERFACE_",p);
    ppcVar9 = (local_1f0->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppcVar9 !=
        (local_1f0->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>)._M_impl
        .super__Vector_impl_data._M_finish) {
      local_1d8 = defaultValue;
      do {
        pcVar2 = *ppcVar9;
        local_1d0 = ppcVar9;
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                        *)pcVar2,&local_50);
        pcVar5 = cmTarget::GetProperty(pcVar2,&local_50,pcVar2->Makefile);
        bVar4 = cmSystemTools::IsOn(pcVar5);
        p_Var1 = &(pcVar2->Properties).
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                  ._M_t._M_impl.super__Rb_tree_header;
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        local_268._M_string_length = 0;
        local_268.field_2._M_local_buf[0] = '\0';
        if ((_Rb_tree_header *)iVar6._M_node != p_Var1) {
          std::__cxx11::string::append((char *)&local_268);
          std::__cxx11::string::_M_append((char *)&local_268,(ulong)(pcVar2->Name)._M_dataplus._M_p)
          ;
          std::__cxx11::string::append((char *)&local_268);
          pcVar5 = "FALSE";
          if (bVar4) {
            pcVar5 = "TRUE";
          }
          local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,pcVar5,pcVar5 + ((ulong)bVar4 ^ 5));
          std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_1c8[0]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
            operator_delete(local_1c8[0]._M_dataplus._M_p,
                            local_1c8[0].field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_268);
        }
        if (local_1e0 == local_1e8) {
          if (local_1f8 == local_200) {
            if ((_Rb_tree_header *)iVar6._M_node != p_Var1) {
              if (!bVar11) {
                local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1c8,local_268._M_dataplus._M_p,
                           local_268._M_dataplus._M_p + local_268._M_string_length);
                std::__cxx11::string::append((char *)local_1c8);
                std::__cxx11::string::_M_append
                          ((char *)&local_220,(ulong)local_1c8[0]._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
                  operator_delete(local_1c8[0]._M_dataplus._M_p,
                                  local_1c8[0].field_2._M_allocated_capacity + 1);
                }
                bVar3 = false;
                bVar11 = true;
                local_278 = (uint)bVar4;
                goto LAB_002b21ae;
              }
              std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_268._M_dataplus._M_p);
              compatibilityAgree_abi_cxx11_(local_1c8,t,false);
              std::__cxx11::string::_M_append
                        ((char *)&local_220,(ulong)local_1c8[0]._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
                operator_delete(local_1c8[0]._M_dataplus._M_p,
                                local_1c8[0].field_2._M_allocated_capacity + 1);
              }
              if (bVar4 != local_278._0_1_) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c8,"The INTERFACE_",0xe);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1c8,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," property of \"",0xe);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(pcVar2->Name)._M_dataplus._M_p,
                                    (pcVar2->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"\" does\nnot agree with the value of ",0x23);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7," already determined\nfor \"",0x19);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(local_228->Name)._M_dataplus._M_p,
                                    (local_228->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".\n",3);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error((char *)local_248,(char *)0x0,(char *)0x0,(char *)0x0);
                goto LAB_002b1ea6;
              }
            }
            goto LAB_002b21a9;
          }
          if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
            local_278 = 0;
            goto LAB_002b21a9;
          }
          std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_268._M_dataplus._M_p);
          compatibilityAgree_abi_cxx11_(local_1c8,t,false);
          std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_1c8[0]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
            operator_delete(local_1c8[0]._M_dataplus._M_p,
                            local_1c8[0].field_2._M_allocated_capacity + 1);
          }
          if (!bVar4) {
            local_278 = 0;
            goto LAB_002b21a9;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Property ",9);
          pcVar5 = local_1d8;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1c8,(p->_M_dataplus)._M_p,p->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," on target \"",0xc);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(local_228->Name)._M_dataplus._M_p,
                              (local_228->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" is\nimplied to be ",0x13);
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
          }
          else {
            sVar8 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar5,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     " because it was used to determine the link libraries\nalready. The INTERFACE_"
                     ,0x4c);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(p->_M_dataplus)._M_p,p->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," property on\ndependency \"",0x19);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(pcVar2->Name)._M_dataplus._M_p,(pcVar2->Name)._M_string_length
                             );
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" is in conflict.\n",0x12);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error((char *)local_248,(char *)0x0,(char *)0x0,(char *)0x0);
          if (local_248 != local_238) {
            operator_delete(local_248,local_238[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
          std::ios_base::~ios_base(local_158);
          bVar3 = true;
          local_278 = 0;
        }
        else {
          if ((_Rb_tree_header *)iVar6._M_node != p_Var1) {
            std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_268._M_dataplus._M_p);
            compatibilityAgree_abi_cxx11_(local_1c8,t,false);
            std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_1c8[0]._M_dataplus._M_p)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
              operator_delete(local_1c8[0]._M_dataplus._M_p,
                              local_1c8[0].field_2._M_allocated_capacity + 1);
            }
            if (bVar4 != local_278._0_1_) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Property ",9)
              ;
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1c8,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," on target \"",0xc);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(local_228->Name)._M_dataplus._M_p,
                                  (local_228->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"\" does\nnot match the INTERFACE_",0x1f);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7," property requirement\nof dependency \"",0x25);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(pcVar2->Name)._M_dataplus._M_p,
                                  (pcVar2->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".\n",3);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error((char *)local_248,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_002b1ea6:
              if (local_248 != local_238) {
                operator_delete(local_248,local_238[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
              std::ios_base::~ios_base(local_158);
              bVar3 = true;
              goto LAB_002b21ae;
            }
          }
LAB_002b21a9:
          bVar3 = false;
        }
LAB_002b21ae:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
      } while ((!bVar3) &&
              (ppcVar9 = local_1d0 + 1,
              ppcVar9 !=
              (local_1f0->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>).
              _M_impl.super__Vector_impl_data._M_finish));
    }
    iVar10 = 0x4ae901;
    if (local_278 != 0) {
      iVar10 = 0x4abb0d;
    }
    local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,iVar10,(local_278 ^ 5) + iVar10);
    pcVar2 = local_228;
    compatibilityType_abi_cxx11_(&local_268,t);
    cmTarget::ReportPropertyOrigin(pcVar2,p,local_1c8,&local_220,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                               local_268.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
      operator_delete(local_1c8[0]._M_dataplus._M_p,local_1c8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar4 = local_278._0_1_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
  }
  local_278._0_1_ = bVar4;
  return local_278._0_1_;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmTarget const* tgt,
                                          const std::string &p,
                                          const std::string& config,
                                          const char *defaultValue,
                                          CompatibleType t,
                                          PropertyType *)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);
  const bool explicitlySet = tgt->GetProperties()
                                  .find(p)
                                  != tgt->GetProperties().end();
  const bool impliedByUse =
          tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet)
      || (!impliedByUse && !explicitlySet));

  std::vector<cmTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if(deps.empty())
    {
    return propContent;
    }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet)
    {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
    }
  else if (impliedByUse)
    {
    report += "\" property is implied by use.\n";
    }
  else
    {
    report += "\" property not set.\n";
    }

  std::string interfaceProperty = "INTERFACE_" + p;
  for(std::vector<cmTarget const*>::const_iterator li =
      deps.begin();
      li != deps.end(); ++li)
    {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    cmTarget const* theTarget = *li;

    const bool ifaceIsSet = theTarget->GetProperties()
                            .find(interfaceProperty)
                            != theTarget->GetProperties().end();
    PropertyType ifacePropContent =
                    getTypedProperty<PropertyType>(theTarget,
                              interfaceProperty);

    std::string reportEntry;
    if (ifaceIsSet)
      {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
      }

    if (explicitlySet)
      {
      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" does\nnot match the "
            "INTERFACE_" << p << " property requirement\nof "
            "dependency \"" << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Explicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else if (impliedByUse)
      {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_" << p << " property on\ndependency \""
            << theTarget->GetName() << "\" is in conflict.\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Implicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else
      {
      if (ifaceIsSet)
        {
        if (propInitialized)
          {
          std::pair<bool, PropertyType> consistent =
                                    consistentProperty(propContent,
                                                       ifacePropContent, t);
          report += reportEntry;
          report += compatibilityAgree(t, propContent != consistent.second);
          if (!consistent.first)
            {
            std::ostringstream e;
            e << "The INTERFACE_" << p << " property of \""
              << theTarget->GetName() << "\" does\nnot agree with the value "
                "of " << p << " already determined\nfor \""
              << tgt->GetName() << "\".\n";
            cmSystemTools::Error(e.str().c_str());
            break;
            }
          else
            {
            propContent = consistent.second;
            continue;
            }
          }
        else
          {
          report += reportEntry + "(Interface set)\n";
          propContent = ifacePropContent;
          propInitialized = true;
          }
        }
      else
        {
        // Not set. Nothing to agree on.
        continue;
        }
      }
    }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}